

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O3

void apply_visitor_to_equipped(player *p,obj_visitor_data *visitor)

{
  _Bool _Var1;
  object *poVar2;
  wchar_t slot;
  
  if ((p->body).count != 0) {
    slot = L'\0';
    do {
      poVar2 = slot_object(p,slot);
      if ((poVar2 != (object *)0x0) &&
         (_Var1 = (*visitor->selfunc)(poVar2,visitor->selfunc_closure), _Var1)) {
        (*visitor->usefunc)(poVar2,visitor->usefunc_closure);
      }
      slot = slot + L'\x01';
    } while ((uint)slot < (uint)(p->body).count);
  }
  return;
}

Assistant:

static void apply_visitor_to_equipped(struct player *p,
	struct obj_visitor_data *visitor)
{
	int i;

	for (i = 0; i < p->body.count; ++i) {
		const struct object *obj = slot_object(p, i);

		if (obj && (*visitor->selfunc)(obj,
			visitor->selfunc_closure)) {
			(*visitor->usefunc)(obj, visitor->usefunc_closure);
		}
	}
}